

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O1

uint8_t * lwsac_scan_extant(lwsac *head,uint8_t *find,size_t len,int nul)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  lwsac *__s1;
  long lVar4;
  lwsac *local_38;
  
  do {
    if (head == (lwsac *)0x0) {
      return (uint8_t *)0x0;
    }
    lVar4 = head->ofs - len;
    if (0x20 < lVar4 && len <= head->ofs - 0x20) {
      __s1 = head + 1;
      uVar1 = *find;
      do {
        if (((*(uint8_t *)&__s1->next == uVar1) &&
            (((nul == 0 || (*(uint8_t *)((long)&__s1->next + len) == '\0')) &&
             (*(uint8_t *)((long)__s1 + (len - 1)) == find[len - 1])))) &&
           (iVar3 = bcmp(__s1,find,len), iVar3 == 0)) {
          bVar2 = false;
          local_38 = __s1;
          goto LAB_0013a14e;
        }
        __s1 = (lwsac *)((long)&__s1->next + 1);
      } while (__s1 < (lwsac *)(lVar4 + (long)head));
    }
    head = head->next;
    bVar2 = true;
LAB_0013a14e:
    if (!bVar2) {
      return (uint8_t *)local_38;
    }
  } while( true );
}

Assistant:

uint8_t *
lwsac_scan_extant(struct lwsac *head, uint8_t *find, size_t len, int nul)
{
	while (head) {
		uint8_t *pos = (uint8_t *)&head[1],
			*end = ((uint8_t *)head) + head->ofs - len;

		if (head->ofs - sizeof(*head) >= len)
			while (pos < end) {
				if (*pos == *find && (!nul || !pos[len]) &&
				    pos[len - 1] == find[len - 1] &&
				    !memcmp(pos, find, len))
					/* found the blob */
					return pos;
				pos++;
			}

		head = head->next;
	}

	return NULL;
}